

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O2

RefPtr<wabt::interp::DefinedFunc> * __thiscall
wabt::interp::Store::
Alloc<wabt::interp::DefinedFunc,wabt::interp::Store&,wabt::interp::Ref&,wabt::interp::FuncDesc&>
          (RefPtr<wabt::interp::DefinedFunc> *__return_storage_ptr__,Store *this,Store *args,
          Ref *args_1,FuncDesc *args_2)

{
  DefinedFunc *this_00;
  Ref RVar1;
  DefinedFunc *local_98;
  FuncDesc local_90;
  
  this_00 = (DefinedFunc *)operator_new(0xe8);
  RVar1 = (Ref)args_1->index;
  FuncDesc::FuncDesc(&local_90,args_2);
  DefinedFunc::DefinedFunc(this_00,(Store *)args_2,RVar1,&local_90);
  local_98 = this_00;
  RVar1.index = FreeList<std::unique_ptr<wabt::interp::Object,std::default_delete<wabt::interp::Object>>>
                ::New<wabt::interp::DefinedFunc*>
                          ((FreeList<std::unique_ptr<wabt::interp::Object,std::default_delete<wabt::interp::Object>>>
                            *)&this->objects_,&local_98);
  FuncDesc::~FuncDesc(&local_90);
  RefPtr<wabt::interp::DefinedFunc>::RefPtr(__return_storage_ptr__,this,RVar1);
  (__return_storage_ptr__->obj_->super_Func).super_Extern.super_Object.self_.index = RVar1.index;
  return __return_storage_ptr__;
}

Assistant:

RefPtr<T> Store::Alloc(Args&&... args) {
  Ref ref{objects_.New(new T(std::forward<Args>(args)...))};
  RefPtr<T> ptr{*this, ref};
  ptr->self_ = ref;
  return ptr;
}